

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::ParseStringProperty
               (string *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  bool bVar1;
  reference o_00;
  string strValue;
  json_const_iterator it;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  json_const_iterator local_58;
  
  local_58.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_58.m_object = (pointer)0x0;
  local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar1 = anon_unknown_57::FindMember(o,(property->_M_dataplus)._M_p,&local_58);
  if (bVar1) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    o_00 = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator*(&local_58);
    bVar1 = anon_unknown_57::GetString(o_00,&local_b8);
    if (bVar1) {
      if (ret != (string *)0x0) {
        std::__cxx11::string::operator=((string *)ret,(string *)&local_b8);
      }
    }
    else if (required && err != (string *)0x0) {
      std::operator+(&local_78,"\'",property);
      std::operator+(&local_98,&local_78,"\' property is not a string type.\n");
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    if (required && err != (string *)0x0) {
      std::operator+(&local_98,"\'",property);
      std::operator+(&local_b8,&local_98,"\' property is missing");
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      if (parent_node->_M_string_length == 0) {
        std::__cxx11::string::append((char *)err);
      }
      else {
        std::operator+(&local_98," in `",parent_node);
        std::operator+(&local_b8,&local_98,"\'.\n");
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ParseStringProperty(
    std::string *ret, std::string *err, const json &o,
    const std::string &property, bool required,
    const std::string &parent_node = std::string()) {
  json_const_iterator it;
  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (parent_node.empty()) {
          (*err) += ".\n";
        } else {
          (*err) += " in `" + parent_node + "'.\n";
        }
      }
    }
    return false;
  }

  std::string strValue;
  if (!GetString(GetValue(it), strValue)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a string type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = std::move(strValue);
  }

  return true;
}